

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 in_RSI;
  int in_EDI;
  char *file_pin;
  char *out_path;
  char *in_path;
  int result;
  int opt;
  int option_index;
  char *in_stack_00002168;
  char *in_stack_00002170;
  char *in_stack_00002178;
  undefined4 local_14;
  undefined8 local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (in_EDI == 1) {
    usage();
    exit(0);
  }
  do {
    iVar1 = getopt_long(local_8,local_10,"hv",long_options,&local_14);
    if (iVar1 == -1) {
      iVar1 = to_pkcs8(in_stack_00002178,in_stack_00002170,in_stack_00002168);
      return iVar1;
    }
    if (iVar1 == 0x68) goto LAB_0010263f;
    if (iVar1 == 0x76) goto LAB_00102621;
    if (iVar1 == 0x100) goto LAB_0010263f;
  } while (((iVar1 == 0x101) || (iVar1 == 0x102)) || (iVar1 == 0x103));
  if (iVar1 == 0x104) {
LAB_00102621:
    printf("%s\n","2.6.1");
    exit(0);
  }
LAB_0010263f:
  usage();
  exit(0);
}

Assistant:

int main(int argc, char* argv[])
{
	int option_index = 0;
	int opt, result;

	char* in_path = NULL;
	char* out_path = NULL;
	char* file_pin = NULL;

	if (argc == 1)
	{
		usage();
		exit(0);
	}

	while ((opt = getopt_long(argc, argv, "hv", long_options, &option_index)) != -1)
	{
		switch (opt)
		{
			case OPT_IN:
				in_path = optarg;
				break;
			case OPT_OUT:
				out_path = optarg;
				break;
			case OPT_PIN:
				file_pin = optarg;
				break;
			case OPT_VERSION:
			case 'v':
				printf("%s\n", PACKAGE_VERSION);
				exit(0);
				break;
			case OPT_HELP:
			case 'h':
			default:
				usage();
				exit(0);
				break;
		}
	}

	// We should convert to PKCS#8
	result = to_pkcs8(in_path, out_path, file_pin);

	return result;
}